

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_write_header(p_ply ply)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  p_ply_element ptVar5;
  long lVar6;
  long lVar7;
  
  if (((ply == (p_ply)0x0) || ((FILE *)ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25d,"int ply_write_header(p_ply)");
  }
  if (ply->element == (p_ply_element)0x0) {
    if (ply->nelements != 0) {
      __assert_fail("ply->element || ply->nelements == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x25e,"int ply_write_header(p_ply)");
    }
  }
  else if (ply->nelements < 1) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25f,"int ply_write_header(p_ply)");
  }
  iVar1 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (iVar1 < 1) {
LAB_00118f8e:
    ply_ferror(ply,"Error writing to file");
    uVar2 = 0;
  }
  else {
    if (0 < ply->ncomments) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        iVar1 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar6);
        if (iVar1 < 1) goto LAB_00118f8e;
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x400;
      } while (lVar4 < ply->ncomments);
    }
    if (0 < ply->nobj_infos) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        iVar1 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar6);
        if (iVar1 < 1) goto LAB_00118f8e;
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x400;
      } while (lVar4 < ply->nobj_infos);
    }
    if (0 < ply->nelements) {
      lVar4 = 0;
      do {
        ptVar5 = ply->element;
        if (ptVar5[lVar4].property == (p_ply_property)0x0) {
          if (ptVar5[lVar4].nproperties != 0) {
            __assert_fail("element->property || element->nproperties == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                          ,0x26a,"int ply_write_header(p_ply)");
          }
        }
        else if (ptVar5[lVar4].nproperties < 1) {
          __assert_fail("!element->property || element->nproperties > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                        ,0x26b,"int ply_write_header(p_ply)");
        }
        ptVar5 = ptVar5 + lVar4;
        iVar1 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar5);
        if (iVar1 < 1) goto LAB_00118f8e;
        if (0 < ptVar5->nproperties) {
          lVar7 = 0;
          lVar6 = 0;
          do {
            uVar3 = (ulong)*(uint *)((long)&ptVar5->property->type + lVar7);
            if (uVar3 == 0x10) {
              iVar1 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                              ply_type_list[*(uint *)((long)&ptVar5->property->length_type + lVar7)]
                             );
            }
            else {
              iVar1 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar3]);
            }
            if (iVar1 < 1) goto LAB_00118f8e;
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 0x128;
          } while (lVar6 < ptVar5->nproperties);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < ply->nelements);
    }
    iVar1 = fprintf((FILE *)ply->fp,"end_header\n");
    uVar2 = (uint)(0 < iVar1);
  }
  return uVar2;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0) goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0) goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0) goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type],
                            property->name) <= 0) goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}